

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

void __thiscall FIX::DateTime::setSecond(DateTime *this,int sec)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = this->m_time / 1000000000;
  uVar3 = (int)uVar2 >> 0x1f;
  uVar1 = (long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / 0x3c;
  setHMS(this,(int)((long)((ulong)uVar3 << 0x20 | uVar2 & 0xffffffff) / 0xe10),
         (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c),sec,
         (int)(((ulong)this->m_time % 1000000000) / 1000000));
  return;
}

Assistant:

void setSecond(int sec) {
    int hour, min, old_sec, millis;
    getHMS(hour, min, old_sec, millis);
    setHMS(hour, min, sec, millis);
  }